

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O2

void __thiscall duckdb::TopNHeap::Reduce(TopNHeap *this)

{
  pointer pTVar1;
  Allocator *allocator;
  ulong uVar2;
  idx_t i;
  ulong uVar3;
  long lVar4;
  string_t sVar5;
  SelectionVector new_payload_sel;
  DataChunk new_heap_data;
  StringHeap new_sort_heap;
  
  uVar3 = this->heap_size * 2;
  uVar2 = 0x2800;
  if (0x2800 < uVar3) {
    uVar2 = uVar3;
  }
  if (uVar2 <= (this->heap_data).count) {
    allocator = Allocator::DefaultAllocator();
    StringHeap::StringHeap(&new_sort_heap,allocator);
    DataChunk::DataChunk(&new_heap_data);
    DataChunk::Initialize
              (&new_heap_data,this->allocator,this->payload_types,
               ((long)(this->heap).
                      super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                      super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->heap).
                     super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                     super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18);
    SelectionVector::SelectionVector
              (&new_payload_sel,
               ((long)(this->heap).
                      super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                      super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->heap).
                     super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                     super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18);
    lVar4 = 0;
    uVar3 = 0;
    while( true ) {
      pTVar1 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
               super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = ((long)(this->heap).
                     super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                     super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x18;
      if (uVar2 <= uVar3) break;
      if (0xc < *(uint *)((long)&(pTVar1->sort_key).value + lVar4)) {
        sVar5 = StringHeap::AddBlob(&new_sort_heap,
                                    (string_t *)((long)&(pTVar1->sort_key).value + lVar4));
        *(long *)((long)&(pTVar1->sort_key).value + lVar4) = sVar5.value._0_8_;
        *(long *)((long)&(pTVar1->sort_key).value + lVar4 + 8) = sVar5.value._8_8_;
      }
      new_payload_sel.sel_vector[uVar3] = *(sel_t *)((long)&pTVar1->index + lVar4);
      *(ulong *)((long)&pTVar1->index + lVar4) = uVar3;
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x18;
    }
    DataChunk::Slice(&new_heap_data,&this->heap_data,&new_payload_sel,uVar2,0);
    DataChunk::Flatten(&new_heap_data);
    StringHeap::Destroy(&this->sort_key_heap);
    StringHeap::Move(&this->sort_key_heap,&new_sort_heap);
    DataChunk::Reference(&this->heap_data,&new_heap_data);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&new_payload_sel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    DataChunk::~DataChunk(&new_heap_data);
    ArenaAllocator::~ArenaAllocator(&new_sort_heap.allocator);
  }
  return;
}

Assistant:

idx_t ReduceThreshold() const {
		return MaxValue<idx_t>(STANDARD_VECTOR_SIZE * 5ULL, 2ULL * heap_size);
	}